

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O2

void __thiscall
apngasm::spec::priv::AbstractSpecReaderImpl::AbstractSpecReaderImpl(AbstractSpecReaderImpl *this)

{
  allocator<char> local_9;
  
  (this->super_ISpecReaderImpl)._vptr_ISpecReaderImpl =
       (_func_int **)&PTR__AbstractSpecReaderImpl_00199028;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_name,"",&local_9);
  this->_loops = 0;
  this->_skipFirst = false;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_frameInfos).
  super__Vector_base<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

AbstractSpecReaderImpl::AbstractSpecReaderImpl()
        : _name("")
        , _loops(0)
        , _skipFirst(false)
        , _frameInfos()
      {
        // nop
      }